

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_ui.cpp
# Opt level: O2

void __thiscall UiWindowX11::UiWindowX11(UiWindowX11 *this,Image *image,string *title)

{
  long lVar1;
  uint32_t uVar2;
  Display *pDVar3;
  Window WVar4;
  Atom AVar5;
  imageException *this_00;
  long lVar6;
  undefined1 auVar7 [16];
  
  UiWindow::UiWindow(&this->super_UiWindow,image,title);
  (this->super_UiWindow)._vptr_UiWindow = (_func_int **)&PTR__UiWindowX11_0011fce8;
  (this->_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->_uiDisplay = (Display *)0x0;
  auVar7 = ZEXT416(0) << 0x40;
  this->_screen = 0;
  this->_deleteWindowEvent = 0;
  this->_window = auVar7._0_8_;
  this->_image = (XImage *)auVar7._8_8_;
  uVar2 = image->_height;
  this->_width = image->_width;
  this->_height = uVar2;
  (this->_point).
  super__Vector_base<std::pair<PointBase2D<double>,_unsigned_int>,_std::allocator<std::pair<PointBase2D<double>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_point).
  super__Vector_base<std::pair<PointBase2D<double>,_unsigned_int>,_std::allocator<std::pair<PointBase2D<double>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar7._0_8_;
  (this->_point).
  super__Vector_base<std::pair<PointBase2D<double>,_unsigned_int>,_std::allocator<std::pair<PointBase2D<double>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar7._8_8_;
  pDVar3 = (Display *)XOpenDisplay(0);
  this->_uiDisplay = pDVar3;
  if (pDVar3 != (Display *)0x0) {
    lVar1 = *(long *)(pDVar3 + 0xe8);
    lVar6 = (long)this->_screen * 0x80;
    WVar4 = XCreateSimpleWindow(pDVar3,*(undefined8 *)(lVar1 + 0x10 + lVar6),10,10,this->_width,
                                this->_height,1,*(undefined8 *)(lVar1 + 0x60 + lVar6),
                                *(undefined8 *)(lVar1 + 0x58 + lVar6));
    this->_window = WVar4;
    XSelectInput(this->_uiDisplay,WVar4,0x8001);
    XMapWindow(this->_uiDisplay,this->_window);
    XStoreName(this->_uiDisplay,this->_window,(title->_M_dataplus)._M_p);
    AVar5 = XInternAtom(this->_uiDisplay,"WM_DELETE_WINDOW",0);
    this->_deleteWindowEvent = AVar5;
    XSetWMProtocols(this->_uiDisplay,this->_window,&this->_deleteWindowEvent,1);
    _setupImage(this,image);
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Cannot create window for display");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

UiWindowX11::UiWindowX11( const PenguinV_Image::Image & image, const std::string & title )
    : UiWindow( image, title )
    , _uiDisplay( nullptr )
    , _screen( 0 )
    , _window( 0 )
    , _image( nullptr )
    , _deleteWindowEvent( 0 )
    , _width( image.width() )
    , _height( image.height() )
{
    _uiDisplay = XOpenDisplay( NULL );
    if ( _uiDisplay == nullptr )
        throw imageException( "Cannot create window for display" );

    _window = XCreateSimpleWindow( _uiDisplay, RootWindow( _uiDisplay, _screen ), 10, 10, _width, _height, 1,
                                   BlackPixel( _uiDisplay, _screen ), WhitePixel( _uiDisplay, _screen ) );
    XSelectInput( _uiDisplay, _window, ExposureMask | KeyPressMask );
    XMapWindow( _uiDisplay, _window );

    XStoreName( _uiDisplay, _window, title.data() );

    _deleteWindowEvent = XInternAtom( _uiDisplay, "WM_DELETE_WINDOW", False );
    XSetWMProtocols( _uiDisplay, _window, &_deleteWindowEvent, 1 );

    _setupImage( image );
}